

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<wchar_t>::NFA(NFA<wchar_t> *this,Stream *stream)

{
  CharClass<wchar_t> local_30;
  
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001b5888;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  local_30._vptr_CharClass = (_func_int **)&PTR__CharClass_001b44e0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  add_state(this,&local_30);
  CharClass<wchar_t>::~CharClass(&local_30);
  parse(this,stream);
  return;
}

Assistant:

NFA(Stream& stream)
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
        
        parse(stream);
    }